

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O1

void src_reset_token_data(Source_File *src,char use_src_as_base)

{
  src->token_size = 0;
  src->best_token_size = 0;
  src->best_token_line = src->which_row;
  src->best_token_column = src->which_column;
  (&src->where_in_src)[(ulong)(use_src_as_base != '\0') * 8] =
       (&src->where_in_src)[(ulong)(use_src_as_base == '\0') * 8];
  src->best_token_where_in_src_start = src->where_in_src;
  return;
}

Assistant:

void src_reset_token_data(struct Source_File *src,char use_src_as_base)
{
	src->token_size=0;
	src->best_token_size=0;
	src->best_token_line=src->which_row;
	src->best_token_column=src->which_column;
	if(use_src_as_base)
	{
		src->best_token_where_in_src_end=src->where_in_src;
	}else
	{
		src->where_in_src=src->best_token_where_in_src_end;
	}
	src->best_token_where_in_src_start=src->where_in_src;
}